

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2260211::XdgDesktopPortalColorPicker::pickColor
          (XdgDesktopPortalColorPicker *this)

{
  QDBusMessage *this_00;
  QDBusPendingCallWatcher *this_01;
  undefined4 *puVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QObject local_e0 [8];
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  qsizetype local_c8;
  QString local_b8;
  QString local_98;
  QDBusMessage message;
  QDBusPendingCall pendingCall;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _message = &DAT_aaaaaaaaaaaaaaaa;
  QVar2.m_data = (storage_type *)0x1e;
  QVar2.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar2);
  _pendingCall = (QArrayData *)local_58.shared;
  QVar3.m_data = (storage_type *)0x1f;
  QVar3.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar3);
  local_98.d.d = (Data *)local_58.shared;
  local_98.d.ptr = (char16_t *)local_58._8_8_;
  local_98.d.size = local_58._16_8_;
  QVar4.m_data = (storage_type *)0x21;
  QVar4.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar4);
  local_b8.d.d = (Data *)local_58.shared;
  local_b8.d.ptr = (char16_t *)local_58._8_8_;
  local_b8.d.size = local_58._16_8_;
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar5);
  local_d8 = (QArrayData *)local_58.shared;
  pcStack_d0 = (char16_t *)local_58._8_8_;
  local_c8 = local_58._16_8_;
  QDBusMessage::createMethodCall((QString *)&message,(QString *)&pendingCall,&local_98,&local_b8);
  if (local_d8 != (QArrayData *)0x0) {
    LOCK();
    (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_d8,2,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (_pendingCall != (QArrayData *)0x0) {
    LOCK();
    (_pendingCall->ref_)._q_value.super___atomic_base<int>._M_i =
         (_pendingCall->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((_pendingCall->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(_pendingCall,2,0x10);
    }
  }
  ::QVariant::QVariant((QVariant *)&local_58,&this->m_parentWindowId);
  this_00 = (QDBusMessage *)QDBusMessage::operator<<(&message,(QVariant *)&local_58);
  local_98.d.d = (Data *)0x0;
  ::QVariant::QVariant((QVariant *)&pendingCall,(QMap *)&local_98);
  QDBusMessage::operator<<(this_00,(QVariant *)&pendingCall);
  ::QVariant::~QVariant((QVariant *)&pendingCall);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2
            ((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
              *)&local_98);
  ::QVariant::~QVariant((QVariant *)&local_58);
  _pendingCall = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  QDBusConnection::sessionBus();
  QDBusConnection::asyncCall((QDBusMessage *)&pendingCall,(int)&local_58);
  QDBusConnection::~QDBusConnection((QDBusConnection *)local_58.data);
  this_01 = (QDBusPendingCallWatcher *)operator_new(0x18);
  QDBusPendingCallWatcher::QDBusPendingCallWatcher(this_01,&pendingCall,(QObject *)this);
  local_58.shared = (PrivateShared *)QDBusPendingCallWatcher::finished;
  local_58._8_8_ = 0;
  puVar1 = (undefined4 *)operator_new(0x18);
  *puVar1 = 1;
  *(code **)(puVar1 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/platform/unix/qdesktopunixservices.cpp:338:17),_QtPrivate::List<QDBusPendingCallWatcher_*>,_void>
       ::impl;
  *(XdgDesktopPortalColorPicker **)(puVar1 + 4) = this;
  QObject::connectImpl
            (local_e0,(void **)this_01,(QObject *)local_58.data,(void **)this,(QSlotObjectBase *)0x0
             ,(ConnectionType)puVar1,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  QDBusPendingCall::~QDBusPendingCall(&pendingCall);
  QDBusMessage::~QDBusMessage(&message);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void pickColor() override
    {
        // DBus signature:
        // PickColor (IN   s      parent_window,
        //            IN   a{sv}  options
        //            OUT  o      handle)
        // Options:
        // handle_token (s) -  A string that will be used as the last element of the @handle.

        QDBusMessage message = QDBusMessage::createMethodCall(
                "org.freedesktop.portal.Desktop"_L1, "/org/freedesktop/portal/desktop"_L1,
                "org.freedesktop.portal.Screenshot"_L1, "PickColor"_L1);
        message << m_parentWindowId << QVariantMap();

        QDBusPendingCall pendingCall = QDBusConnection::sessionBus().asyncCall(message);
        auto watcher = new QDBusPendingCallWatcher(pendingCall, this);
        connect(watcher, &QDBusPendingCallWatcher::finished, this,
                [this](QDBusPendingCallWatcher *watcher) {
                    watcher->deleteLater();
                    QDBusPendingReply<QDBusObjectPath> reply = *watcher;
                    if (reply.isError()) {
                        qWarning("DBus call to pick color failed: %s",
                                 qPrintable(reply.error().message()));
                        Q_EMIT colorPicked({});
                    } else {
                        QDBusConnection::sessionBus().connect(
                                "org.freedesktop.portal.Desktop"_L1, reply.value().path(),
                                "org.freedesktop.portal.Request"_L1, "Response"_L1, this,
                                // clang-format off
                                SLOT(gotColorResponse(uint,QVariantMap))
                                // clang-format on
                        );
                    }
                });
    }